

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpUpvalues(Proto *f,DumpState *D)

{
  int x;
  int local_1c;
  int n;
  int i;
  DumpState *D_local;
  Proto *f_local;
  
  x = f->sizeupvalues;
  DumpInt(x,D);
  for (local_1c = 0; local_1c < x; local_1c = local_1c + 1) {
    DumpByte((uint)f->upvalues[local_1c].instack,D);
    DumpByte((uint)f->upvalues[local_1c].idx,D);
  }
  return;
}

Assistant:

static void DumpUpvalues (const Proto *f, DumpState *D) {
  int i, n = f->sizeupvalues;
  DumpInt(n, D);
  for (i = 0; i < n; i++) {
    DumpByte(f->upvalues[i].instack, D);
    DumpByte(f->upvalues[i].idx, D);
  }
}